

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

void __thiscall duckdb::ZSTDCompressionState::InitializeVector(ZSTDCompressionState *this)

{
  CompressionInfo *info;
  unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true> *this_00
  ;
  ZSTD_CCtx *cctx;
  page_offset_t pVar1;
  int value;
  idx_t iVar2;
  pointer pZVar3;
  BufferHandle *pBVar4;
  data_ptr_t pdVar5;
  idx_t iVar6;
  block_id_t bVar7;
  ulong uVar8;
  
  iVar2 = 0x800;
  if (this->total_vector_count <= this->vector_count + 1) {
    pZVar3 = unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true>
             ::operator->(&this->analyze_state);
    iVar2 = pZVar3->count + this->vector_count * -0x800;
  }
  this->vector_size = iVar2;
  pVar1 = GetCurrentOffset(this);
  uVar8 = (ulong)(pVar1 + 3 & 0xfffffffc);
  pBVar4 = optional_ptr<duckdb::BufferHandle,_true>::operator->(&this->current_buffer);
  pdVar5 = BufferHandle::Ptr(pBVar4);
  this->current_buffer_ptr = pdVar5 + uVar8;
  this->uncompressed_size = 0;
  this->compressed_size = 0;
  iVar2 = this->vector_in_segment_count;
  info = &(this->super_CompressionState).info;
  iVar6 = GetWritableSpace(info);
  if (iVar6 < (iVar2 * 0x14 + 0x1b & 0xfffffffffffffff8) + iVar2 * 8 + 8) {
    NewSegment(this);
  }
  iVar2 = this->vector_size;
  iVar6 = GetWritableSpace(info);
  if (iVar6 <= uVar8 + iVar2 * 4) {
    NewPage(this,false);
  }
  pVar1 = GetCurrentOffset(this);
  this->starting_offset = pVar1;
  pBVar4 = (this->current_buffer).ptr;
  if (&this->segment_handle == pBVar4) {
    bVar7 = -1;
  }
  else {
    bVar7 = this->block_id;
  }
  this->starting_page = bVar7;
  (this->vector_lengths_buffer).ptr = pBVar4;
  pBVar4 = optional_ptr<duckdb::BufferHandle,_true>::operator->(&this->current_buffer);
  pdVar5 = BufferHandle::Ptr(pBVar4);
  this->string_lengths = (string_length_t *)(pdVar5 + pVar1);
  this->current_buffer_ptr = (data_ptr_t)((long)(pdVar5 + pVar1) + this->vector_size * 4);
  ResetOutBuffer(this);
  this_00 = &this->analyze_state;
  pZVar3 = unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true>
           ::operator->(this_00);
  duckdb_zstd::ZSTD_CCtx_reset(pZVar3->context,ZSTD_reset_session_only);
  pZVar3 = unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true>
           ::operator->(this_00);
  duckdb_zstd::ZSTD_CCtx_refCDict(pZVar3->context,(ZSTD_CDict *)0x0);
  pZVar3 = unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true>
           ::operator->(this_00);
  cctx = pZVar3->context;
  value = duckdb_zstd::ZSTD_defaultCLevel();
  duckdb_zstd::ZSTD_CCtx_setParameter(cctx,ZSTD_c_compressionLevel,value);
  this->in_vector = true;
  return;
}

Assistant:

void InitializeVector() {
		D_ASSERT(!in_vector);
		if (vector_count + 1 >= total_vector_count) {
			vector_size = analyze_state->count - (ZSTD_VECTOR_SIZE * vector_count);
		} else {
			vector_size = ZSTD_VECTOR_SIZE;
		}
		auto current_offset = GetCurrentOffset();
		current_offset = UnsafeNumericCast<page_offset_t>(
		    AlignValue<idx_t, sizeof(string_length_t)>(UnsafeNumericCast<idx_t>(current_offset)));
		current_buffer_ptr = current_buffer->Ptr() + current_offset;
		compressed_size = 0;
		uncompressed_size = 0;

		if (GetVectorMetadataSize(vector_in_segment_count + 1) > GetWritableSpace(info)) {
			D_ASSERT(vector_in_segment_count <= vectors_per_segment);
			// Can't fit this vector on this segment anymore, have to flush and a grab new one
			NewSegment();
		}

		if (current_offset + (vector_size * sizeof(string_length_t)) >= GetWritableSpace(info)) {
			// Check if there is room on the current page for the vector data
			NewPage();
		}
		current_offset = GetCurrentOffset();
		starting_offset = current_offset;
		starting_page = GetCurrentId();

		vector_lengths_buffer = current_buffer;
		string_lengths = reinterpret_cast<string_length_t *>(current_buffer->Ptr() + current_offset);
		current_buffer_ptr = reinterpret_cast<data_ptr_t>(string_lengths);
		current_buffer_ptr += vector_size * sizeof(string_length_t);
		// 'out_buffer' should be set to point directly after the string_lengths
		ResetOutBuffer();

		// Initialize the context for streaming compression
		duckdb_zstd::ZSTD_CCtx_reset(analyze_state->context, duckdb_zstd::ZSTD_reset_session_only);
		duckdb_zstd::ZSTD_CCtx_refCDict(analyze_state->context, nullptr);
		duckdb_zstd::ZSTD_CCtx_setParameter(analyze_state->context, duckdb_zstd::ZSTD_c_compressionLevel,
		                                    GetCompressionLevel());
		in_vector = true;
	}